

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::SplitTxOut
          (ConfidentialTransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *nonce_list)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  undefined8 uVar7;
  const_reference pvVar8;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *in_RCX;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *in_RDX;
  uint in_ESI;
  Amount *in_RDI;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *in_R8;
  CfdException *except;
  size_t txout_idx;
  ByteData prev_tx;
  Amount update_amount;
  Amount *amount;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range1;
  bool has_fee_asset;
  Amount fee;
  ConfidentialAssetId fee_asset;
  Amount total_amount;
  Amount base_amount;
  ConfidentialAssetId asset;
  ConfidentialTxOutReference ref;
  ConfidentialTxOutReference *in_stack_fffffffffffffae8;
  ConfidentialTxOutReference *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  CfdError CVar9;
  CfdException *in_stack_fffffffffffffb10;
  CfdException *this_00;
  ConfidentialTransactionContext *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb98;
  ConfidentialTransactionContext *this_01;
  undefined1 local_3e1 [33];
  ulong local_3c0;
  undefined1 local_3b8 [24];
  undefined8 local_3a0;
  undefined1 local_398;
  undefined8 local_390;
  undefined1 local_388;
  undefined8 local_380;
  undefined1 local_378;
  undefined1 local_36a;
  allocator local_369;
  string local_368 [32];
  undefined8 local_348;
  undefined1 local_340;
  reference local_338;
  Amount *local_330;
  __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
  local_328;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *local_320;
  string local_318 [32];
  string local_2f8 [39];
  byte local_2d1;
  undefined8 local_2d0;
  undefined1 local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8;
  ConfidentialAssetId local_2b0;
  undefined8 local_288;
  undefined1 local_280;
  undefined8 local_278;
  undefined1 local_270;
  undefined8 local_240;
  undefined1 local_238;
  undefined1 local_230 [48];
  string local_200 [88];
  ConfidentialTransactionContext local_1a8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [38];
  undefined1 local_5a;
  allocator local_59;
  string local_58 [48];
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *local_28;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *local_20;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *local_18;
  uint local_c;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  if ((SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
       ::kMinimumAmount == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                                   ::kMinimumAmount), iVar4 != 0)) {
    cfd::core::Amount::Amount
              ((Amount *)
               &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                ::kMinimumAmount,100);
    __cxa_guard_release(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                         ::kMinimumAmount);
  }
  sVar5 = std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::size(local_18);
  sVar6 = std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::size(local_20);
  if (sVar5 == sVar6) {
    sVar5 = std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::size(local_18);
    sVar6 = std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
            ::size(local_28);
    if (sVar5 == sVar6) {
      bVar2 = std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                        ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                         in_stack_fffffffffffffb00);
      if (bVar2) {
        local_82 = 1;
        uVar7 = __cxa_allocate_exception(0x30);
        CVar9 = (CfdError)((ulong)in_stack_fffffffffffffb08 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"list is empty.",&local_81);
        core::CfdException::CfdException(in_stack_fffffffffffffb10,CVar9,in_stack_fffffffffffffb00);
        local_82 = 0;
        __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      bVar2 = HasBlinding(in_stack_fffffffffffffb48);
      if (bVar2) {
        local_aa = 1;
        uVar7 = __cxa_allocate_exception(0x30);
        CVar9 = (CfdError)((ulong)in_stack_fffffffffffffb08 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"Already blinded.",&local_a9);
        core::CfdException::CfdException(in_stack_fffffffffffffb10,CVar9,in_stack_fffffffffffffb00);
        local_aa = 0;
        __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      this_01 = &local_1a8;
      cfd::core::ConfidentialTransaction::GetTxOut((uint)this_01);
      core::AbstractTxOutReference::GetLockingScript
                (&in_stack_fffffffffffffae8->super_AbstractTxOutReference);
      bVar3 = cfd::core::Script::IsEmpty();
      core::Script::~Script((Script *)in_stack_fffffffffffffaf0);
      if ((bVar3 & 1) != 0) {
        local_230[0x2e] = 1;
        uVar7 = __cxa_allocate_exception(0x30);
        CVar9 = (CfdError)((ulong)in_stack_fffffffffffffb08 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_200,"Target is fee output.",(allocator *)(local_230 + 0x2f));
        core::CfdException::CfdException(in_stack_fffffffffffffb10,CVar9,in_stack_fffffffffffffb00);
        local_230[0x2e] = 0;
        __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::ConfidentialTxOutReference::GetAsset(in_stack_fffffffffffffae8);
      core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_fffffffffffffae8);
      local_278 = cfd::core::ConfidentialValue::GetAmount();
      local_270 = extraout_DL;
      local_240 = local_278;
      local_238 = extraout_DL;
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x408d92);
      cfd::core::Amount::Amount((Amount *)&local_288);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_2b0);
      local_2d0 = GetFeeAmount(this_01,(ConfidentialAssetId *)
                                       CONCAT17(bVar3,in_stack_fffffffffffffb98));
      local_2d1 = 0;
      local_2c8 = extraout_DL_00;
      local_2c0 = local_2d0;
      local_2b8 = extraout_DL_00;
      bVar3 = cfd::core::operator>((Amount *)&local_2c0,0);
      if ((bVar3 & 1) != 0) {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        local_2d1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        std::__cxx11::string::~string(local_318);
        std::__cxx11::string::~string(local_2f8);
        local_288 = SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                    ::kMinimumAmount;
        local_280 = DAT_0059ab00;
      }
      local_320 = local_18;
      local_328._M_current =
           (Amount *)
           std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::begin
                     ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                      in_stack_fffffffffffffae8);
      local_330 = (Amount *)
                  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::end
                            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                             in_stack_fffffffffffffae8);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                            *)in_stack_fffffffffffffaf0,
                           (__normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                            *)in_stack_fffffffffffffae8);
        CVar9 = (CfdError)((ulong)in_stack_fffffffffffffb08 >> 0x20);
        if (!bVar2) break;
        local_338 = __gnu_cxx::
                    __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                    ::operator*(&local_328);
        local_348 = cfd::core::Amount::operator+=((Amount *)&local_288,local_338);
        local_340 = extraout_DL_01;
        __gnu_cxx::
        __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
        ::operator++(&local_328);
      }
      bVar3 = cfd::core::operator<((Amount *)&local_240,(Amount *)&local_288);
      if ((bVar3 & 1) != 0) {
        local_36a = 1;
        uVar7 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_368,"The Amount is too large.",&local_369);
        core::CfdException::CfdException(in_stack_fffffffffffffb10,CVar9,in_stack_fffffffffffffb00);
        local_36a = 0;
        __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      if ((local_2d1 & 1) != 0) {
        local_380 = cfd::core::Amount::operator-=
                              ((Amount *)&local_288,
                               (Amount *)
                               &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                                ::kMinimumAmount);
        local_378 = extraout_DL_02;
      }
      local_3a0 = cfd::core::operator-((Amount *)&local_240,(Amount *)&local_288);
      local_398 = extraout_DL_03;
      local_390 = local_3a0;
      local_388 = extraout_DL_03;
      (**(code **)(*(long *)in_RDI + 0x40))(local_3b8);
      cfd::core::ConfidentialTransaction::SetTxOutValue((uint)in_RDI,(Amount *)(ulong)local_c);
      local_3c0 = 0;
      while( true ) {
        uVar1 = local_3c0;
        sVar5 = std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::size(local_18);
        if (sVar5 <= uVar1) {
          core::ByteData::~ByteData((ByteData *)0x4094c7);
          core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x4094d4);
          core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x4094e1);
          core::ConfidentialTxOutReference::~ConfidentialTxOutReference(in_stack_fffffffffffffaf0);
          return;
        }
        std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                  (local_20,local_3c0);
        bVar3 = cfd::core::Script::IsEmpty();
        if ((bVar3 & 1) != 0) break;
        in_stack_fffffffffffffaf0 =
             (ConfidentialTxOutReference *)
             std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::operator[]
                       (local_18,local_3c0);
        pvVar8 = std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                           (local_20,local_3c0);
        std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
        operator[](local_28,local_3c0);
        cfd::core::ConfidentialTransaction::AddTxOut
                  (in_RDI,(ConfidentialAssetId *)in_stack_fffffffffffffaf0,(Script *)local_230,
                   (ConfidentialNonce *)pvVar8);
        local_3c0 = local_3c0 + 1;
      }
      uVar7 = __cxa_allocate_exception(0x30);
      this_00 = (CfdException *)local_3e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_3e1 + 1),"Locking script is empty.",(allocator *)this_00);
      core::CfdException::CfdException
                (this_00,(CfdError)((ulong)uVar7 >> 0x20),in_stack_fffffffffffffb00);
      __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  CVar9 = (CfdError)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  local_5a = 1;
  uVar7 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"Unmatch each list count.",&local_59);
  core::CfdException::CfdException(in_stack_fffffffffffffb10,CVar9,in_stack_fffffffffffffb00);
  local_5a = 0;
  __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void ConfidentialTransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Script>& locking_script_list,
    const std::vector<ConfidentialNonce>& nonce_list) {
  static const Amount kMinimumAmount(int64_t{100});

  if ((amount_list.size() != locking_script_list.size()) ||
      (amount_list.size() != nonce_list.size())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch each list count.");
  } else if (amount_list.empty()) {
    throw CfdException(CfdError::kCfdIllegalArgumentError, "list is empty.");
  } else if (HasBlinding()) {
    throw CfdException(CfdError::kCfdIllegalStateError, "Already blinded.");
  }

  auto ref = GetTxOut(index);
  if (ref.GetLockingScript().IsEmpty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target is fee output.");
  }

  auto asset = ref.GetAsset();
  auto base_amount = ref.GetConfidentialValue().GetAmount();
  Amount total_amount;
  ConfidentialAssetId fee_asset;
  auto fee = GetFeeAmount(&fee_asset);
  bool has_fee_asset = false;
  if (fee > 0) {
    has_fee_asset = (asset.GetHex() == fee_asset.GetHex());
    total_amount = kMinimumAmount;
  }

  for (const auto& amount : amount_list) total_amount += amount;

  if (base_amount < total_amount) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "The Amount is too large.");
  }
  if (has_fee_asset) total_amount -= kMinimumAmount;
  Amount update_amount = base_amount - total_amount;

  ByteData prev_tx = GetData();
  try {
    SetTxOutValue(index, update_amount);
    for (size_t txout_idx = 0; txout_idx < amount_list.size(); ++txout_idx) {
      if (locking_script_list[txout_idx].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Locking script is empty.");
      }
      AddTxOut(
          amount_list[txout_idx], asset, locking_script_list[txout_idx],
          nonce_list[txout_idx]);
    }
  } catch (const CfdException& except) {
    SetFromHex(prev_tx.GetHex());  // rollback
    throw except;
  }
}